

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powell.hpp
# Opt level: O2

vec3f optimize(vec3f initial,function<double_(vec3f)> *loss)

{
  double dVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  pointer pvVar4;
  pointer pdVar5;
  iterator iVar6;
  long lVar7;
  pointer pvVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar11;
  float fVar12;
  vec3f __args;
  vec3f vVar13;
  vec3f vVar14;
  initializer_list<vec3f> __l;
  float local_104;
  undefined8 local_100;
  float local_f8;
  vec3f d;
  undefined1 local_d8 [48];
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  double local_80;
  double local_78;
  vector<vec3f,_std::allocator<vec3f>_> dir;
  vector<double,_std::allocator<double>_> improvement;
  
  local_104 = initial.z;
  local_d8._8_4_ = in_XMM0_Dc;
  local_d8._0_8_ = initial._0_8_;
  local_d8._12_4_ = in_XMM0_Dd;
  improvement.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3f800000;
  improvement.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  improvement.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3f800000;
  __l._M_len = 3;
  __l._M_array = (iterator)&improvement;
  std::vector<vec3f,_std::allocator<vec3f>_>::vector(&dir,__l,(allocator_type *)&local_100);
  do {
    auVar3 = local_d8._0_16_;
    improvement.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    improvement.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    improvement.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_100 = local_d8._0_8_;
    local_f8 = local_104;
    vVar13.z = local_104;
    vVar13.x = (data_t)local_d8._0_4_;
    vVar13.y = (data_t)local_d8._4_4_;
    dVar1 = std::function<double_(vec3f)>::operator()(loss,vVar13);
    pvVar4 = dir.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    uVar9 = SUB84(dVar1,0);
    uVar10 = (undefined4)((ulong)dVar1 >> 0x20);
    pvVar8 = dir.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
             _M_start;
    while( true ) {
      local_d8._0_4_ = auVar3._0_4_;
      local_d8._4_4_ = auVar3._4_4_;
      if (pvVar8 == pvVar4) break;
      d.z = pvVar8->z;
      d.x = pvVar8->x;
      d.y = pvVar8->y;
      local_a8._M_unused._M_object = (void *)0x0;
      local_a8._8_8_ = 0;
      local_98 = (code *)0x0;
      pcStack_90 = (code *)0x0;
      local_a8._M_unused._M_object = operator_new(0x18);
      *(function<double_(vec3f)> **)local_a8._M_unused._0_8_ = loss;
      *(undefined8 **)((long)local_a8._M_unused._0_8_ + 8) = &local_100;
      *(vec3f **)((long)local_a8._M_unused._0_8_ + 0x10) = &d;
      pcStack_90 = std::
                   _Function_handler<double_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/powell.hpp:65:27)>
                   ::_M_invoke;
      local_98 = std::
                 _Function_handler<double_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/powell.hpp:65:27)>
                 ::_M_manager;
      dVar1 = optimize(0.0,(function<double_(double)> *)&local_a8);
      std::_Function_base::~_Function_base((_Function_base *)&local_a8);
      fVar11 = (float)dVar1;
      __args.x = d.x * fVar11 + (float)local_100;
      fVar12 = d.y * fVar11 + local_100._4_4_;
      __args.z = fVar11 * d.z + local_f8;
      __args.y = fVar12;
      local_80 = std::function<double_(vec3f)>::operator()(loss,__args);
      local_78 = (double)CONCAT44(uVar10,uVar9) - local_80;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&improvement,&local_78);
      pvVar8 = pvVar8 + 1;
      uVar9 = SUB84(local_80,0);
      uVar10 = (undefined4)((ulong)local_80 >> 0x20);
      local_100 = CONCAT44(fVar12,__args.x);
      local_f8 = __args.z;
    }
    dVar1 = 0.0;
    for (pdVar5 = improvement.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar5 != improvement.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish; pdVar5 = pdVar5 + 1) {
      dVar1 = dVar1 + *pdVar5;
    }
    d.z = local_f8 - local_104;
    d.y = (float)(local_100 >> 0x20) - (float)local_d8._4_4_;
    d.x = (float)local_100 - (float)local_d8._0_4_;
    vVar13 = normalized(&d);
    iVar6 = argmax<std::vector<double,std::allocator<double>>>(&improvement);
    fVar11 = local_f8;
    uVar2 = local_100;
    lVar7 = (long)iVar6._M_current -
            (long)improvement.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    dir.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_start
    [lVar7].x = (data_t)(int)vVar13._0_8_;
    dir.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_start
    [lVar7].y = (data_t)(int)((ulong)vVar13._0_8_ >> 0x20);
    dir.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_start
    [lVar7].z = vVar13.z;
    local_d8._8_8_ = 0;
    local_d8._0_8_ = local_100;
    local_104 = local_f8;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&improvement);
  } while (1e-05 <= dVar1);
  std::_Vector_base<vec3f,_std::allocator<vec3f>_>::~_Vector_base
            (&dir.super__Vector_base<vec3f,_std::allocator<vec3f>_>);
  vVar14.z = fVar11;
  local_100._0_4_ = (float)uVar2;
  local_100._4_4_ = SUB84(uVar2,4);
  vVar14.x = (float)local_100;
  vVar14.y = local_100._4_4_;
  return vVar14;
}

Assistant:

vec3f optimize(vec3f initial, std::function<double(vec3f)> loss)
{
	// Powell's method
	std::vector<vec3f> dir = {{1,0,0},{0,1,0},{0,0,1}};
	vec3f x0 = initial;
	double totalimprove = 0;
	while (true) {
		std::vector<double> improvement;
		vec3f x = x0;
		double f = loss(x0);
		for (auto d: dir) {
			double t = optimize(0, [&](double t){return loss(x+t*d);});
			vec3f x1 = x+t*d;
			double f1 = loss(x1);
			improvement.push_back(f - f1);
			x = x1;
			f = f1;
		}
		double improve = std::accumulate(improvement.begin(), improvement.end(), 0.0);
		// console.log("  improve",improve);
		totalimprove += improve;
		dir[argmax(improvement) - improvement.begin()] = normalized(x-x0);
		x0 = x;
		if (improve < 1e-5) break;
	}
	// console.log("total improve:", totalimprove);
	return x0;
}